

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

bool __thiscall
LLVMBC::ModuleParseContext::parse_metadata_attachment_record
          (ModuleParseContext *this,BlockOrRecord *entry)

{
  uint64_t *puVar1;
  MetadataKind MVar2;
  Instruction *this_00;
  const_iterator cVar3;
  MDNode *node;
  size_t sVar4;
  LoggingCallback p_Var5;
  void *pvVar6;
  char *__s;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  char buffer [4096];
  String local_1038 [128];
  
  if (entry->id != 0xb) {
    return true;
  }
  puVar1 = (entry->ops).
           super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  lVar8 = (long)(entry->ops).
                super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar8 != 0) {
    this_00 = get_instruction(this,*puVar1);
    if (this_00 == (Instruction *)0x0) {
      p_Var5 = ::dxil_spv::get_thread_log_callback();
      if (p_Var5 == (LoggingCallback)0x0) {
        parse_metadata_attachment_record();
        return false;
      }
      local_1038[0]._M_string_length._0_6_ = 0x757274736e69;
      local_1038[0]._M_string_length._6_2_ = 0x7463;
      local_1038[0].field_2._M_allocated_capacity._0_6_ = 0xa2e6e6f69;
    }
    else {
      uVar9 = (lVar8 >> 3) - 1;
      if (uVar9 < 2) {
        return true;
      }
      uVar9 = uVar9 >> 1;
      lVar8 = 0;
      uVar7 = 0;
      while( true ) {
        local_1038[0]._M_dataplus._M_p =
             *(pointer *)
              ((long)(entry->ops).
                     super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar8 + 8);
        cVar3 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->metadata_kind_map)._M_h,(key_type_conflict *)local_1038);
        if (cVar3.
            super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          __s = (char *)0x0;
        }
        else {
          __s = *(char **)((long)cVar3.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>,_false>
                                 ._M_cur + 0x10);
        }
        node = (MDNode *)
               get_metadata(this,*(uint64_t *)
                                  ((long)(entry->ops).
                                         super__Vector_base<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar8 + 0x10));
        if (node == (MDNode *)0x0) break;
        MVar2 = MDOperand::get_metadata_kind((MDOperand *)node);
        if (MVar2 != Node) {
          node = (MDNode *)0x0;
        }
        if (__s == (char *)0x0) goto LAB_0018295b;
        if (node == (MDNode *)0x0) goto LAB_00182930;
        local_1038[0]._M_dataplus._M_p = (pointer)&local_1038[0].field_2;
        sVar4 = strlen(__s);
        std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>
        ::_M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *
                   )local_1038,__s,__s + sVar4);
        Instruction::setMetadata(this_00,local_1038,node);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
             *)local_1038[0]._M_dataplus._M_p != &local_1038[0].field_2) {
          ::dxil_spv::free_in_thread(local_1038[0]._M_dataplus._M_p);
        }
        uVar7 = uVar7 + 1;
        lVar8 = lVar8 + 0x10;
        if (uVar9 + (uVar9 == 0) == uVar7) {
          return uVar9 <= uVar7;
        }
      }
      if (__s == (char *)0x0) {
LAB_0018295b:
        p_Var5 = ::dxil_spv::get_thread_log_callback();
        if (p_Var5 == (LoggingCallback)0x0) {
          parse_metadata_attachment_record();
          return false;
        }
        local_1038[0]._M_string_length._0_6_ = 0x61646174656d;
        local_1038[0]._M_string_length._6_2_ = 0x6174;
        local_1038[0].field_2._M_allocated_capacity._0_6_ = 0x2e646e696b20;
        local_1038[0].field_2._M_allocated_capacity._6_2_ = 10;
      }
      else {
LAB_00182930:
        p_Var5 = ::dxil_spv::get_thread_log_callback();
        if (p_Var5 == (LoggingCallback)0x0) {
          parse_metadata_attachment_record();
          return false;
        }
        local_1038[0].field_2._M_allocated_capacity._0_6_ = 0x636174746120;
        local_1038[0].field_2._M_allocated_capacity._6_2_ = 0x6d68;
        local_1038[0].field_2._8_6_ = 0xa2e746e65;
        local_1038[0]._M_string_length._0_6_ = 0x61646174656d;
        local_1038[0]._M_string_length._6_2_ = 0x6174;
      }
    }
    local_1038[0]._M_dataplus._M_p = (pointer)0x2064696c61766e49;
    pvVar6 = ::dxil_spv::get_thread_log_callback_userdata();
    (*p_Var5)(pvVar6,Error,(char *)local_1038);
  }
  return false;
}

Assistant:

bool ModuleParseContext::parse_metadata_attachment_record(const BlockOrRecord &entry)
{
	if (MetaDataRecord(entry.id) != MetaDataRecord::ATTACHMENT)
		return true;

	if (entry.ops.size() < 1)
		return false;

	size_t size = entry.ops.size();
	size_t num_nodes = (size - 1) / 2;
	auto *inst = get_instruction(entry.ops[0]);

	if (!inst)
	{
		LOGE("Invalid instruction.\n");
		return false;
	}

	for (size_t i = 0; i < num_nodes; i++)
	{
		auto *kind = get_metadata_kind(entry.ops[2 * i + 1]);
		auto *operand = get_metadata(entry.ops[2 * i + 2]);
		auto *node = dyn_cast<MDNode>(operand);

		if (!kind)
		{
			LOGE("Invalid metadata kind.\n");
			return false;
		}

		if (!node)
		{
			LOGE("Invalid metadata attachment.\n");
			return false;
		}

		inst->setMetadata(kind, node);
	}
	return true;
}